

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  AssertionResult *this_00;
  AssertionResultData *__str;
  OfType OVar1;
  pointer pMVar2;
  bool bVar3;
  XmlWriter *this_01;
  char *__s;
  MessageInfo *msg;
  pointer pMVar4;
  ostream *os;
  Column local_c8;
  ReusableStringStream rss;
  string local_80;
  ScopedElement e;
  string elementName;
  
  OVar1 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar1 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  elementName._M_dataplus._M_p = (pointer)&elementName.field_2;
  elementName._M_string_length = 0;
  elementName.field_2._M_local_buf[0] = '\0';
  __s = "failure";
  if (1 < (uint)(OVar1 + ~FailureBit)) {
    if (((OVar1 == Unknown) || (OVar1 == FailureBit)) || (OVar1 == Exception)) {
      __s = "internalError";
    }
    else {
      if (OVar1 != FatalErrorCondition) {
        if (OVar1 == DidntThrowException) goto LAB_00124dd8;
        if (OVar1 != ThrewException) goto LAB_00124de2;
      }
      __s = "error";
    }
  }
LAB_00124dd8:
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&elementName,__s);
LAB_00124de2:
  this_01 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_01,(XmlFormatting)&elementName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"message",(allocator<char> *)&rss);
  this_00 = &stats->assertionResult;
  AssertionResult::getExpression_abi_cxx11_(&local_80,this_00);
  XmlWriter::writeAttribute(this_01,(string *)&local_c8,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"type",(allocator<char> *)&rss);
  local_80._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
  local_80._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
  XmlWriter::writeAttribute<Catch::StringRef>(this_01,(string *)&local_c8,(StringRef *)&local_80);
  std::__cxx11::string::~string((string *)&local_c8);
  ReusableStringStream::ReusableStringStream(&rss);
  os = rss.m_oss;
  if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
      (stats->totals).assertions.failedButOk == 0) {
    std::operator<<(rss.m_oss,'\n');
  }
  else {
    std::operator<<(rss.m_oss,"FAILED");
    std::operator<<(os,":\n");
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::operator<<(os,"  ");
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)&local_c8,this_00);
      std::operator<<(os,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::operator<<(os,'\n');
    }
    bVar3 = AssertionResult::hasExpandedExpression(this_00);
    if (bVar3) {
      std::operator<<(os,"with expansion:\n");
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_80,this_00);
      clara::TextFlow::Column::Column(&local_c8,&local_80);
      local_c8.m_indent = 2;
      clara::TextFlow::operator<<(os,&local_c8);
      std::operator<<(os,'\n');
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.m_strings);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  __str = &(stats->assertionResult).m_resultData;
  std::__cxx11::string::string((string *)&local_c8,&__str->message);
  std::__cxx11::string::~string((string *)&local_c8);
  if (local_c8.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::__cxx11::string::string((string *)&local_c8,&__str->message);
    std::operator<<(os,(string *)&local_c8);
    std::operator<<(os,'\n');
    std::__cxx11::string::~string((string *)&local_c8);
  }
  pMVar2 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar4 = (stats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar4 != pMVar2; pMVar4 = pMVar4 + 1) {
    if (pMVar4->type == Info) {
      std::operator<<(os,(string *)&pMVar4->message);
      os = rss.m_oss;
      std::operator<<(rss.m_oss,'\n');
    }
  }
  std::operator<<(os,"at ");
  local_c8.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(stats->assertionResult).m_info.lineInfo.file
  ;
  local_c8.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(stats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(os,(SourceLineInfo *)&local_c8);
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(this_01,(string *)&local_c8,Newline);
  std::__cxx11::string::~string((string *)&local_c8);
  ReusableStringStream::~ReusableStringStream(&rss);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  std::__cxx11::string::~string((string *)&elementName);
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk( m_resultData.resultType ) || shouldSuppressFailure( m_info.resultDisposition );
    }